

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O2

double inform_bin(double *series,size_t n,int b,int *binned,inform_error *err)

{
  double dVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  double dVar4;
  double local_58;
  double max;
  double min;
  
  if (series == (double *)0x0) {
LAB_0010818f:
    local_58 = 0.0;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
  }
  else {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0.0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0.0;
    }
    if (b < 2) {
      local_58 = 0.0;
    }
    else {
      if (binned == (int *)0x0) goto LAB_0010818f;
      local_58 = inform_range(series,n,&min,&max,err);
      local_58 = local_58 / (double)b;
      if (2.220446049250313e-15 < local_58) {
        sVar3 = 0;
        do {
          if (n == sVar3) {
            return local_58;
          }
          dVar1 = series[sVar3];
          dVar4 = floor((dVar1 - min) / local_58);
          uVar2 = (int)dVar4 - (uint)(dVar1 == max);
          binned[sVar3] = uVar2;
          sVar3 = sVar3 + 1;
        } while (uVar2 < (uint)b);
        __assert_fail("0 <= binned[i] && binned[i] < b",
                      "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                      ,0x36,"double inform_bin(const double *, size_t, int, int *, inform_error *)")
        ;
      }
      memset(binned,0,n << 2);
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBIN;
    }
  }
  return local_58;
}

Assistant:

double inform_bin(double const *series, size_t n, int b, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0.0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    double step = range / b;

    if (step <= 10.*DBL_EPSILON)
    {
        memset(binned, 0, n*sizeof(int));
        INFORM_ERROR_RETURN(err, INFORM_EBIN, step);
    }

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step) - (series[i] == max);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return step;
}